

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_8(QPDF *pdf,char *arg2)

{
  byte bVar1;
  logic_error *this;
  Provider *this_00;
  ostream *this_01;
  exception *e;
  QPDFWriter local_188 [8];
  QPDFWriter w;
  QPDFObjectHandle local_178;
  allocator<char> local_161;
  string local_160 [32];
  QPDFObjectHandle local_140;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_130;
  undefined1 local_120 [8];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p;
  shared_ptr<Buffer> local_108;
  Provider *local_f8;
  Provider *provider;
  shared_ptr<Buffer> b;
  Pl_Flate p2;
  Pl_Buffer local_a8 [8];
  Pl_Buffer p1;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  QPDFObjectHandle qstream;
  QPDFObjectHandle root;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/QStream",&local_59);
  QPDFObjectHandle::getKey((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = QPDFObjectHandle::isStream();
  if ((bVar1 & 1) == 0) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"test 7 run on file with no QStream");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  Pl_Buffer::Pl_Buffer(local_a8,"buffer",(Pipeline *)0x0);
  Pl_Flate::Pl_Flate((Pl_Flate *)
                     &b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     "compress",(Pipeline *)local_a8,a_deflate,0x10000);
  Pipeline::operator<<
            ((Pipeline *)&b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "new data for stream\n");
  Pl_Flate::finish();
  Pl_Buffer::getBufferSharedPointer();
  this_00 = (Provider *)operator_new(0x28);
  p.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 1;
  std::shared_ptr<Buffer>::shared_ptr(&local_108,(shared_ptr<Buffer> *)&provider);
  Provider::Provider(this_00,&local_108);
  p.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 0;
  std::shared_ptr<Buffer>::~shared_ptr(&local_108);
  local_f8 = this_00;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr<Provider,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_120,this_00);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            (&local_130,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"/FlateDecode",&local_161);
  QPDFObjectHandle::newName((string *)&local_140);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData(local_38,&local_130,&local_140,&local_178);
  QPDFObjectHandle::~QPDFObjectHandle(&local_178);
  QPDFObjectHandle::~QPDFObjectHandle(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_130);
  Provider::badLength(local_f8,false);
  QPDFWriter::QPDFWriter(local_188,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_188,0));
  QPDFWriter::setLinearization(SUB81(local_188,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_188);
  QPDFWriter::write();
  Provider::badLength(local_f8,true);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&e);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&e);
  this_01 = std::operator<<((ostream *)&std::cout,"oops -- getStreamData didn\'t throw");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  QPDFWriter::~QPDFWriter(local_188);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_120);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&provider);
  Pl_Flate::~Pl_Flate((Pl_Flate *)
                      &b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Pl_Buffer::~Pl_Buffer(local_a8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &qstream.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_8(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle qstream = root.getKey("/QStream");
    if (!qstream.isStream()) {
        throw std::logic_error("test 7 run on file with no QStream");
    }
    Pl_Buffer p1("buffer");
    Pl_Flate p2("compress", &p1, Pl_Flate::a_deflate);
    p2 << "new data for stream\n";
    p2.finish();
    auto b = p1.getBufferSharedPointer();
    // This is a bogus way to use StreamDataProvider, but it does
    // adequately test its functionality.
    auto* provider = new Provider(b);
    auto p = std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(provider);
    qstream.replaceStreamData(
        p, QPDFObjectHandle::newName("/FlateDecode"), QPDFObjectHandle::newNull());
    provider->badLength(false);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    // Linearize to force the provider to be called multiple times.
    w.setLinearization(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();

    // Every time a provider pipes stream data, it has to provide
    // the same amount of data.
    provider->badLength(true);
    try {
        qstream.getStreamData();
        std::cout << "oops -- getStreamData didn't throw" << std::endl;
    } catch (std::exception const& e) {
        std::cout << "exception: " << e.what() << std::endl;
    }
}